

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFindPackageCommand::cmFindPackageCommand(cmFindPackageCommand *this,cmExecutionStatus *status)

{
  mapped_type *pmVar1;
  allocator<char> local_49;
  key_type local_48;
  cmExecutionStatus *local_18;
  cmExecutionStatus *status_local;
  cmFindPackageCommand *this_local;
  
  local_18 = status;
  status_local = (cmExecutionStatus *)this;
  cmFindCommon::cmFindCommon(&this->super_cmFindCommon,status);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>_>
  ::map(&this->OriginalDefs);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
  ::map(&this->DeprecatedFindModules);
  std::__cxx11::string::string((string *)&this->Name);
  std::__cxx11::string::string((string *)&this->Variable);
  std::__cxx11::string::string((string *)&this->VersionComplete);
  std::__cxx11::string::string((string *)&this->VersionRange);
  this->VersionRangeMin = VERSION_ENDPOINT_INCLUDED;
  this->VersionRangeMax = VERSION_ENDPOINT_INCLUDED;
  std::__cxx11::string::string((string *)&this->Version);
  this->VersionMajor = 0;
  this->VersionMinor = 0;
  this->VersionPatch = 0;
  this->VersionTweak = 0;
  this->VersionCount = 0;
  std::__cxx11::string::string((string *)&this->VersionMax);
  this->VersionMaxMajor = 0;
  this->VersionMaxMinor = 0;
  this->VersionMaxPatch = 0;
  this->VersionMaxTweak = 0;
  this->VersionMaxCount = 0;
  this->VersionExact = false;
  std::__cxx11::string::string((string *)&this->FileFound);
  std::__cxx11::string::string((string *)&this->VersionFound);
  this->VersionFoundMajor = 0;
  this->VersionFoundMinor = 0;
  this->VersionFoundPatch = 0;
  this->VersionFoundTweak = 0;
  this->VersionFoundCount = 0;
  this->RequiredCMakeVersion = 0;
  this->Quiet = false;
  this->Required = false;
  this->UseConfigFiles = true;
  this->UseFindModules = true;
  this->NoUserRegistry = false;
  this->NoSystemRegistry = false;
  this->UseLib32Paths = false;
  this->UseLib64Paths = false;
  this->UseLibx32Paths = false;
  this->UseRealPath = false;
  this->PolicyScope = true;
  this->GlobalScope = false;
  this->RegistryViewDefined = false;
  std::__cxx11::string::string((string *)&this->LibraryArchitecture);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Names);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Configs);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->IgnoredPaths);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->IgnoredPrefixPaths);
  std::__cxx11::string::string((string *)&this->DebugBuffer);
  this->SortOrder = None;
  this->SortDirection = Asc;
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::vector(&this->ConsideredConfigs);
  std::__cxx11::string::operator=((string *)&(this->super_cmFindCommon).CMakePathName,"PACKAGE");
  (this->super_cmFindCommon).DebugMode = false;
  AppendSearchPathGroups(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Qt",&local_49);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
           ::operator[](&this->DeprecatedFindModules,&local_48);
  *pmVar1 = CMP0084;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

cmFindPackageCommand::cmFindPackageCommand(cmExecutionStatus& status)
  : cmFindCommon(status)
  , VersionRangeMin(VERSION_ENDPOINT_INCLUDED)
  , VersionRangeMax(VERSION_ENDPOINT_INCLUDED)
{
  this->CMakePathName = "PACKAGE";
  this->DebugMode = false;
  this->AppendSearchPathGroups();

  this->DeprecatedFindModules["Qt"] = cmPolicies::CMP0084;
}